

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_sqrt(sexp ctx,sexp a,sexp_conflict *rem_out)

{
  void *__s;
  char cVar1;
  ulong uVar2;
  sexp psVar3;
  ulong uVar4;
  double dVar5;
  sexp tmp;
  sexp rem;
  sexp tmpa;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_a0;
  sexp local_98;
  sexp local_90;
  sexp local_88;
  size_t local_80;
  sexp_gc_var_t local_78;
  sexp_gc_var_t local_68;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_a0 = (sexp)0x43e;
  local_78.var = (sexp_conflict *)0x0;
  local_78.next = (sexp_gc_var_t *)0x0;
  local_90 = (sexp)&DAT_0000043e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_98 = (sexp)&DAT_0000043e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_88 = (sexp)&DAT_0000043e;
  local_68.var = (sexp_conflict *)0x0;
  local_68.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)a & 3) != 0) || (a->tag != 0xc)) {
    psVar3 = sexp_type_exception(ctx,(sexp)0x0,0xc,a);
    return psVar3;
  }
  local_78.var = &local_a0;
  local_48.next = &local_78;
  local_78.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  local_48.var = &local_90;
  local_58.next = &local_48;
  (ctx->value).context.saves = local_58.next;
  local_58.var = &local_98;
  local_68.next = &local_58;
  (ctx->value).context.saves = local_68.next;
  local_68.var = &local_88;
  (ctx->value).context.saves = &local_68;
  if ((a->tag != 0xc) || (-1 < (a->value).flonum_bits[0])) goto LAB_0011bb05;
  uVar4 = (a->value).string.offset;
  local_80 = uVar4 * 8;
  psVar3 = sexp_alloc_tagged_aux(ctx,uVar4 * 8 + 0x18,0xc);
  (psVar3->value).string.offset = uVar4;
  uVar2 = (a->value).string.offset;
  if (uVar2 < uVar4) {
    uVar4 = uVar2;
  }
  cVar1 = (a->value).flonum_bits[0];
  (psVar3->value).flonum_bits[0] = cVar1;
  __s = (void *)((long)&psVar3->value + 0x10);
  memset(__s,0,local_80);
  memmove(__s,(void *)((long)&a->value + 0x10),uVar4 << 3);
  a = psVar3;
  local_88 = psVar3;
  if (((ulong)psVar3 & 3) == 0) {
    if (psVar3->tag == 0xc) {
      (psVar3->value).flonum_bits[0] = -cVar1;
      goto LAB_0011bb05;
    }
    if (psVar3->tag == 0xb) {
      (psVar3->value).stack.length = (psVar3->value).stack.length ^ 0x8000000000000000;
      goto LAB_0011bb05;
    }
  }
  if (((ulong)psVar3 & 1) != 0) {
    a = (sexp)(1 - ((ulong)psVar3 & 0xfffffffffffffffe));
  }
LAB_0011bb05:
  dVar5 = sexp_bignum_to_double(a);
  local_a0 = sexp_make_flonum(ctx,dVar5);
  local_a0 = sexp_inexact_sqrt(ctx,(sexp)0x0,1,local_a0);
  if (((ulong)local_a0 & 3) == 0) {
    if ((local_a0->tag == 0xb) && (dVar5 = (local_a0->value).flonum, 1073741824.0 < dVar5)) {
      if (dVar5 < INFINITY) {
        local_a0 = sexp_double_to_bignum(ctx,dVar5);
      }
      else {
        local_a0 = sexp_bignum_sqrt_estimate(ctx,a);
      }
      do {
        local_90 = sexp_mul(ctx,local_a0,local_a0);
        local_98 = sexp_sub(ctx,a,local_90);
        local_90 = local_98;
        if (((ulong)local_98 & 1) == 0) {
          if (((((ulong)local_98 & 2) != 0) || (local_98->tag != 0xc)) ||
             (-1 < (local_98->value).flonum_bits[0])) {
LAB_0011bd21:
            if (((((ulong)local_98 & 3) != 0) || (local_98->tag != 0xb)) ||
               (0.0 < (local_98->value).flonum || (local_98->value).flonum == 0.0)) {
              local_98 = sexp_sub(ctx,local_98,(sexp)&DAT_00000003);
              local_98 = sexp_quotient(ctx,local_98,(sexp)&DAT_00000005);
              local_98 = sexp_compare(ctx,local_98,local_a0);
              if (((ulong)local_98 & 1) == 0) {
                if (((((ulong)local_98 & 2) == 0) && (local_98->tag == 0xc)) &&
                   ((local_98->value).flonum_bits[0] < '\0')) goto LAB_0011bbd2;
              }
              else if ((long)local_98 < 0) goto LAB_0011bbd2;
              if (((((ulong)local_98 & 3) == 0) && (local_98->tag == 0xb)) &&
                 ((local_98->value).flonum <= 0.0 && (local_98->value).flonum != 0.0))
              goto LAB_0011bbd2;
            }
          }
        }
        else if (-1 < (long)local_98) goto LAB_0011bd21;
        local_98 = sexp_quotient(ctx,a,local_a0);
        local_a0 = sexp_add(ctx,local_a0,local_98);
        local_a0 = sexp_quotient(ctx,local_a0,(sexp)&DAT_00000005);
      } while( true );
    }
    if ((((ulong)local_a0 & 3) == 0) && (local_a0->tag == 0xb)) {
      psVar3 = sexp_double_to_bignum(ctx,(local_a0->value).flonum);
      local_a0 = sexp_bignum_normalize(psVar3);
    }
  }
  local_98 = sexp_mul(ctx,local_a0,local_a0);
  local_90 = sexp_sub(ctx,a,local_98);
LAB_0011bbd2:
  psVar3 = sexp_bignum_normalize(local_90);
  *rem_out = psVar3;
  (ctx->value).context.saves = local_78.next;
  psVar3 = sexp_bignum_normalize(local_a0);
  return psVar3;
}

Assistant:

sexp sexp_bignum_sqrt (sexp ctx, sexp a, sexp* rem_out) {
  sexp_gc_var4(res, rem, tmp, tmpa);
  if (! sexp_bignump(a)) return sexp_type_exception(ctx, NULL, SEXP_BIGNUM, a);
  sexp_gc_preserve4(ctx, res, rem, tmp, tmpa);
  /* initial estimate via flonum, ignoring signs */
  if (sexp_exact_negativep(a)) {
    tmpa = sexp_copy_bignum(ctx, NULL, a, 0);
    a = tmpa;
    sexp_negate(a);
  }
  res = sexp_make_flonum(ctx, sexp_bignum_to_double(a));
  res = sexp_inexact_sqrt(ctx, NULL, 1, res);
  if (sexp_flonump(res) &&
      sexp_flonum_value(res) > SEXP_MAX_ACCURATE_FLONUM_SQRT) {
    if (isinf(sexp_flonum_value(res)))
      res = sexp_bignum_sqrt_estimate(ctx, a);
    else
      res = sexp_double_to_bignum(ctx, sexp_flonum_value(res));
  loop:                           /* until 0 <= a - res*res < 2*res + 1 */
    rem = sexp_mul(ctx, res, res);
    tmp = rem = sexp_sub(ctx, a, rem);
    if (!sexp_positivep(tmp)) goto adjust;
    tmp = sexp_sub(ctx, tmp, SEXP_ONE);
    tmp = sexp_quotient(ctx, tmp, SEXP_TWO);
    tmp = sexp_compare(ctx, tmp, res);
    if (sexp_positivep(tmp)) {
    adjust:
      tmp = sexp_quotient(ctx, a, res);
      res = sexp_add(ctx, res, tmp);
      res = sexp_quotient(ctx, res, SEXP_TWO);
      goto loop;
    }
  } else {
    if (sexp_flonump(res))
      res = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(res)));
    tmp = sexp_mul(ctx, res, res);
    rem = sexp_sub(ctx, a, tmp);
  }
  *rem_out = sexp_bignum_normalize(rem);
  sexp_gc_release4(ctx);
  return sexp_bignum_normalize(res);
}